

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cpp
# Opt level: O0

bool OpenCLEnum::compareDevice(Device *dev1,Device *dev2)

{
  bool bVar1;
  Device *dev2_local;
  Device *dev1_local;
  
  bVar1 = std::operator>(&dev1->name,&dev2->name);
  if (bVar1) {
    dev1_local._7_1_ = false;
  }
  else {
    bVar1 = std::operator<(&dev1->name,&dev2->name);
    if (bVar1) {
      dev1_local._7_1_ = true;
    }
    else if (dev2->id < dev1->id) {
      dev1_local._7_1_ = false;
    }
    else {
      dev1_local._7_1_ = true;
    }
  }
  return dev1_local._7_1_;
}

Assistant:

bool OpenCLEnum::compareDevice(const Device &dev1, const Device &dev2)
{
	if (dev1.name	> dev2.name)	return false;
	if (dev1.name	< dev2.name)	return true;
	if (dev1.id		> dev2.id)		return false;
	return true;
}